

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

DWORD MAPConvertProtectToAccess(DWORD flProtect)

{
  if (flProtect == 2) {
    return 4;
  }
  if (flProtect != 8) {
    if (flProtect == 4) {
      return 6;
    }
    fprintf(_stderr,"] %s %s:%d","MAPConvertProtectToAccess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x686);
    fprintf(_stderr,"Unknown flag for flProtect. This line should not have been executed.\n ");
    return 0xffffffff;
  }
  return 1;
}

Assistant:

static DWORD MAPConvertProtectToAccess( DWORD flProtect )
{
    if ( PAGE_READONLY == flProtect )
    {
        return FILE_MAP_READ;
    }
    if ( PAGE_READWRITE == flProtect )
    {
        return FILE_MAP_ALL_ACCESS;
    }
    if ( PAGE_WRITECOPY == flProtect )
    {
        return FILE_MAP_COPY;
    }

    ASSERT( "Unknown flag for flProtect. This line "
            "should not have been executed.\n " );
    return (DWORD) -1;
}